

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cc
# Opt level: O3

EnumValue * __thiscall
google::protobuf::util::converter::FindEnumValueByNameOrNull
          (converter *this,Enum *enum_type,StringPiece enum_name)

{
  string *psVar1;
  Enum *__s1;
  char *size;
  int iVar2;
  Type *pTVar3;
  char *__n;
  int index;
  stringpiece_ssize_type len;
  
  __n = enum_name.ptr_;
  if ((this != (converter *)0x0) && (0 < *(int *)(this + 0x18))) {
    index = 0;
    do {
      pTVar3 = protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumValue>::TypeHandler>
                         ((RepeatedPtrFieldBase *)(this + 0x10),index);
      psVar1 = (pTVar3->name_).ptr_;
      __s1 = (Enum *)(psVar1->_M_dataplus)._M_p;
      size = (char *)psVar1->_M_string_length;
      if ((long)size < 0) {
        StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion");
      }
      if (size == __n) {
        if (__s1 == enum_type) {
          return pTVar3;
        }
        if ((long)__n < 1) {
          return pTVar3;
        }
        iVar2 = bcmp(__s1,enum_type,(size_t)__n);
        if (iVar2 == 0) {
          return pTVar3;
        }
      }
      index = index + 1;
    } while (index < *(int *)(this + 0x18));
  }
  return (EnumValue *)0x0;
}

Assistant:

const google::protobuf::EnumValue* FindEnumValueByNameOrNull(
    const google::protobuf::Enum* enum_type, StringPiece enum_name) {
  if (enum_type != nullptr) {
    for (int i = 0; i < enum_type->enumvalue_size(); ++i) {
      const google::protobuf::EnumValue& enum_value = enum_type->enumvalue(i);
      if (enum_value.name() == enum_name) {
        return &enum_value;
      }
    }
  }
  return nullptr;
}